

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O0

void __thiscall
ritobin::io::text_write_impl::BinTextWriter::
write_items<std::vector<ritobin::Element,std::allocator<ritobin::Element>>>
          (BinTextWriter *this,vector<ritobin::Element,_std::allocator<ritobin::Element>_> *items)

{
  bool bVar1;
  reference item_00;
  Element *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<ritobin::Element,_std::allocator<ritobin::Element>_> *__range3;
  vector<ritobin::Element,_std::allocator<ritobin::Element>_> *items_local;
  BinTextWriter *this_local;
  
  bVar1 = std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>::empty(items);
  if (bVar1) {
    TextWriter::write_raw<3ul>(&this->writer,(char (*) [3])"{}");
  }
  else {
    TextWriter::write_raw<3ul>(&this->writer,(char (*) [3])"{\n");
    TextWriter::ident_inc(&this->writer);
    __end0 = std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>::begin(items);
    item = (Element *)std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>::end(items);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_ritobin::Element_*,_std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>_>
                        (&__end0,(__normal_iterator<const_ritobin::Element_*,_std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>_>
                                  *)&item);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      item_00 = __gnu_cxx::
                __normal_iterator<const_ritobin::Element_*,_std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>_>
                ::operator*(&__end0);
      write_item(this,item_00);
      __gnu_cxx::
      __normal_iterator<const_ritobin::Element_*,_std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>_>
      ::operator++(&__end0);
    }
    TextWriter::ident_dec(&this->writer);
    TextWriter::pad(&this->writer);
    TextWriter::write_raw<2ul>(&this->writer,(char (*) [2])0x1b0b10);
  }
  return;
}

Assistant:

void write_items(T const& items) noexcept {
            if (items.empty()) {
                writer.write_raw("{}");
                return;
            }
            writer.write_raw("{\n");
            writer.ident_inc();
            for (auto const& item : items) {
                write_item(item);
            }
            writer.ident_dec();
            writer.pad();
            writer.write_raw("}");
        }